

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int resolve_hash_table_find_equal(void *val1_p,void *val2_p,int mod,void *UNUSED_cb_data)

{
  LYS_NODE LVar1;
  lys_node *node;
  undefined8 *puVar2;
  lys_node *plVar3;
  char *pcVar4;
  lyd_node *node_00;
  hash_table *__s1;
  long lVar5;
  int iVar6;
  lys_module *plVar7;
  lys_module *plVar8;
  lyd_node **pplVar9;
  long *plVar10;
  uint uVar11;
  ulong local_38;
  
  if (mod != 0) {
    __assert_fail("!mod",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x485,"int resolve_hash_table_find_equal(void *, void *, int, void *)");
  }
  node = *val1_p;
  puVar2 = *val2_p;
  plVar3 = (lys_node *)*puVar2;
  uVar11 = 0;
  if (plVar3 == node) {
    LVar1 = plVar3->nodetype;
    uVar11 = 1;
    if (((LVar1 != LYS_CONTAINER) && (LVar1 != LYS_LEAF)) && (LVar1 != LYS_ANYDATA)) {
      plVar10 = *(long **)((long)val1_p + 0x10);
      if (LVar1 == LYS_LIST) {
        if (plVar3->padding[2] == 0) {
          __assert_fail("((struct lys_node_list *)val2->schema)->keys_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0x49c,"int resolve_hash_table_find_equal(void *, void *, int, void *)");
        }
        uVar11 = *(uint *)((long)val1_p + 8);
        if (uVar11 != plVar3->padding[2]) {
          __assert_fail("((struct lys_node_list *)val2->schema)->keys_size == pp.len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0x49d,"int resolve_hash_table_find_equal(void *, void *, int, void *)");
        }
        pplVar9 = (lyd_node **)(puVar2 + 8);
        for (local_38 = 0; (node_00 = *pplVar9, node_00 != (lyd_node *)0x0 && (local_38 < uVar11));
            local_38 = local_38 + 1) {
          lVar5 = *plVar10;
          plVar7 = lyd_node_module(node_00);
          if (lVar5 == 0) {
            plVar8 = lys_node_module(node);
            if (plVar7 != plVar8) break;
          }
          else {
            iVar6 = strncmp(plVar7->name,(char *)*plVar10,(long)(int)plVar10[1]);
            if ((iVar6 != 0) ||
               (plVar7 = lyd_node_module(node_00), plVar7->name[(int)plVar10[1]] != '\0')) break;
          }
          pcVar4 = node_00->schema->name;
          lVar5 = plVar10[3];
          iVar6 = strncmp(pcVar4,(char *)plVar10[2],(long)(int)lVar5);
          if ((iVar6 != 0) || (pcVar4[(int)lVar5] != '\0')) break;
          __s1 = node_00->ht;
          lVar5 = plVar10[5];
          iVar6 = strncmp((char *)__s1,(char *)plVar10[4],(long)(int)lVar5);
          if ((iVar6 != 0) || (*(char *)((long)&__s1->used + (long)(int)lVar5) != '\0')) break;
          pplVar9 = &node_00->next;
          plVar10 = plVar10 + 6;
        }
        uVar11 = (uint)(uVar11 == (uint)local_38);
      }
      else if (LVar1 != LYS_ANYXML) {
        if (LVar1 == LYS_LEAFLIST) {
          pcVar4 = (char *)puVar2[7];
          lVar5 = plVar10[5];
          iVar6 = strncmp(pcVar4,(char *)plVar10[4],(long)(int)lVar5);
          if ((iVar6 != 0) || (pcVar4[(int)lVar5] != '\0')) {
            uVar11 = 0;
          }
        }
        else {
          uVar11 = 0;
          ly_log(plVar3->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                 ,0x4c5);
        }
      }
    }
  }
  return uVar11;
}

Assistant:

static int
resolve_hash_table_find_equal(void *val1_p, void *val2_p, int mod, void *UNUSED(cb_data))
{
    struct lyd_node *val2, *elem2;
    struct parsed_pred pp;
    const char *str;
    int i;

    assert(!mod);
    (void)mod;

    pp = *((struct parsed_pred *)val1_p);
    val2 = *((struct lyd_node **)val2_p);

    if (val2->schema != pp.schema) {
        return 0;
    }

    switch (val2->schema->nodetype) {
    case LYS_CONTAINER:
    case LYS_LEAF:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return 1;
    case LYS_LEAFLIST:
        str = ((struct lyd_node_leaf_list *)val2)->value_str;
        if (!strncmp(str, pp.pred[0].value, pp.pred[0].val_len) && !str[pp.pred[0].val_len]) {
            return 1;
        }
        return 0;
    case LYS_LIST:
        assert(((struct lys_node_list *)val2->schema)->keys_size);
        assert(((struct lys_node_list *)val2->schema)->keys_size == pp.len);

        /* lists with keys, their equivalence is based on their keys */
        elem2 = val2->child;
        /* the exact data order is guaranteed */
        for (i = 0; elem2 && (i < pp.len); ++i) {
            /* module check */
            if (pp.pred[i].mod_name) {
                if (strncmp(lyd_node_module(elem2)->name, pp.pred[i].mod_name, pp.pred[i].mod_name_len)
                        || lyd_node_module(elem2)->name[pp.pred[i].mod_name_len]) {
                    break;
                }
            } else {
                if (lyd_node_module(elem2) != lys_node_module(pp.schema)) {
                    break;
                }
            }

            /* name check */
            if (strncmp(elem2->schema->name, pp.pred[i].name, pp.pred[i].nam_len) || elem2->schema->name[pp.pred[i].nam_len]) {
                break;
            }

            /* value check */
            str = ((struct lyd_node_leaf_list *)elem2)->value_str;
            if (strncmp(str, pp.pred[i].value, pp.pred[i].val_len) || str[pp.pred[i].val_len]) {
                break;
            }

            /* next key */
            elem2 = elem2->next;
        }
        if (i == pp.len) {
            return 1;
        }
        return 0;
    default:
        break;
    }

    LOGINT(val2->schema->module->ctx);
    return 0;
}